

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::SetAttribute
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *this,
          DynamicObject *instance,SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor,
          PropertyAttributes attribute)

{
  byte bVar1;
  Type *pTVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  PropertyAttributes oldAttributes;
  byte bVar7;
  byte bVar8;
  
  bVar8 = descriptor->Attributes;
  if ((bVar8 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x758,"(!(descriptor->Attributes & 0x10))",
                                "!(descriptor->Attributes & PropertyLetConstGlobal)");
    if (!bVar4) goto LAB_00dee97f;
    *puVar6 = 0;
    bVar8 = descriptor->Attributes;
  }
  BVar5 = 0;
  if (((bVar8 & 8) == 0) && (bVar7 = attribute | bVar8, BVar5 = 0, bVar7 != bVar8)) {
    bVar1 = (this->super_DynamicTypeHandler).flags;
    if ((bVar1 & 4) == 0) {
      pTVar2 = (instance->super_RecyclableObject).type.ptr;
      bVar8 = bVar7;
      if (*(char *)&pTVar2[1].javascriptLibrary.ptr == '\x01') {
        if (((bVar1 & 0x10) != 0) ||
           (*(char *)((long)&pTVar2[1].javascriptLibrary.ptr + 1) == '\x01')) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x770,
                                      "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                      ,
                                      "!GetIsShared() && !instance->GetDynamicType()->GetIsShared()"
                                     );
          if (!bVar4) {
LAB_00dee97f:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
        }
        DynamicObject::ChangeType(instance);
      }
    }
    else {
      descriptor->Attributes = bVar7;
      ConvertToNonSharedSimpleDictionaryType(this,instance);
    }
    descriptor->Attributes = bVar8;
    BVar5 = 1;
  }
  return BVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetAttribute(DynamicObject* instance, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, PropertyAttributes attribute)
    {
        Assert(!(descriptor->Attributes & PropertyLetConstGlobal));
        if (descriptor->Attributes & PropertyDeleted)
        {
            return false;
        }

        PropertyAttributes attributes = descriptor->Attributes;
        attributes |= attribute;
        if (attributes == descriptor->Attributes)
        {
            return false;
        }

        if (GetIsLocked())
        {
            PropertyAttributes oldAttributes = descriptor->Attributes;
            descriptor->Attributes = attributes;
            ConvertToNonSharedSimpleDictionaryType(instance); // This changes TypeHandler, but non-necessarily Type.
            descriptor->Attributes = oldAttributes;
        }
        else
        {
            if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            descriptor->Attributes = attributes;
        }
        return true;
    }